

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O0

int16_t WebRtcIsac_UpdateUplinkJitter(BwEstimatorstr *bwest_str,int32_t index)

{
  int32_t index_local;
  BwEstimatorstr *bwest_str_local;
  
  if ((bwest_str->external_bw_info).in_use == 0) {
    if ((index < 0) || (0x17 < index)) {
      bwest_str_local._6_2_ = -0x1860;
    }
    else {
      if (index < 1) {
        bwest_str->send_max_delay_avg = bwest_str->send_max_delay_avg * 0.9 + 0.5;
      }
      else {
        bwest_str->send_max_delay_avg = bwest_str->send_max_delay_avg * 0.9 + 2.5;
      }
      bwest_str_local._6_2_ = 0;
    }
    return bwest_str_local._6_2_;
  }
  __assert_fail("!bwest_str->external_bw_info.in_use",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/main/source/bandwidth_estimator.c"
                ,0x23f,"int16_t WebRtcIsac_UpdateUplinkJitter(BwEstimatorstr *, int32_t)");
}

Assistant:

int16_t WebRtcIsac_UpdateUplinkJitter(
    BwEstimatorstr*              bwest_str,
    int32_t                  index)
{
  assert(!bwest_str->external_bw_info.in_use);

  if((index < 0) || (index > 23))
  {
    return -ISAC_RANGE_ERROR_BW_ESTIMATOR;
  }

  if(index > 0)
  {
    /* compute the jitter estimate as decoded on the other side */
    bwest_str->send_max_delay_avg = 0.9f * bwest_str->send_max_delay_avg +
        0.1f * (float)MAX_ISAC_MD;
  }
  else
  {
    /* compute the jitter estimate as decoded on the other side */
    bwest_str->send_max_delay_avg = 0.9f * bwest_str->send_max_delay_avg +
        0.1f * (float)MIN_ISAC_MD;
  }

  return 0;
}